

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEAInterface.cpp
# Opt level: O0

int connectnmeainterface(RS232PORT *pNMEAInterfacePseudoRS232Port)

{
  int iVar1;
  RS232PORT *pNMEAInterfacePseudoRS232Port_local;
  
  iVar1 = OpenRS232Port(pNMEAInterfacePseudoRS232Port,szNMEAInterfacePath);
  if (iVar1 == 0) {
    iVar1 = SetOptionsRS232Port(pNMEAInterfacePseudoRS232Port,NMEAInterfaceBaudRate,'\0',0,'\b','\0'
                                ,NMEAInterfaceTimeout);
    if (iVar1 == 0) {
      printf("NMEAInterface connected.\n");
      pNMEAInterfacePseudoRS232Port_local._4_4_ = 0;
    }
    else {
      printf("Unable to connect to a NMEAInterface.\n");
      CloseRS232Port(pNMEAInterfacePseudoRS232Port);
      pNMEAInterfacePseudoRS232Port_local._4_4_ = 1;
    }
  }
  else {
    printf("Unable to connect to a NMEAInterface.\n");
    pNMEAInterfacePseudoRS232Port_local._4_4_ = 1;
  }
  return pNMEAInterfacePseudoRS232Port_local._4_4_;
}

Assistant:

int connectnmeainterface(RS232PORT* pNMEAInterfacePseudoRS232Port)
{
	if (OpenRS232Port(pNMEAInterfacePseudoRS232Port, szNMEAInterfacePath) != EXIT_SUCCESS) 
	{
		printf("Unable to connect to a NMEAInterface.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(pNMEAInterfacePseudoRS232Port, NMEAInterfaceBaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)NMEAInterfaceTimeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NMEAInterface.\n");
		CloseRS232Port(pNMEAInterfacePseudoRS232Port);
		return EXIT_FAILURE;
	}

	printf("NMEAInterface connected.\n");

	return EXIT_SUCCESS;
}